

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::at
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this,size_t i)

{
  json_storage_kind jVar1;
  array_storage *paVar2;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  undefined8 uVar4;
  json_runtime_error<std::domain_error,_void> *this_00;
  allocator<char> *__a;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RSI;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  string *in_stack_ffffffffffffff48;
  json_array<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
  *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  sorted_json_object<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
  *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffe0;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *local_8;
  
  jVar1 = storage_kind(in_RDI);
  __a = (allocator<char> *)(ulong)(byte)(jVar1 - json_const_reference);
  switch(__a) {
  case (allocator<char> *)0x0:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50);
    json_const_reference_storage::value((json_const_reference_storage *)0x666937);
    local_8 = at(in_RSI,in_stack_ffffffffffffffe0);
    break;
  case (allocator<char> *)0x1:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50);
    json_reference_storage::value((json_reference_storage *)0x666966);
    local_8 = at(in_RSI,in_stack_ffffffffffffffe0);
    break;
  default:
    uVar5 = 1;
    this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,
               (char *)CONCAT17(in_stack_ffffffffffffff8f,CONCAT16(uVar5,in_stack_ffffffffffffff88))
               ,__a);
    json_runtime_error<std::domain_error,_void>::json_runtime_error
              (this_00,in_stack_ffffffffffffff48);
    __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                json_runtime_error<std::domain_error,_void>::~json_runtime_error);
  case (allocator<char> *)0x5:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50);
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
    value_abi_cxx11_((object_storage *)in_stack_ffffffffffffff90);
    local_8 = sorted_json_object<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
              ::at(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case (allocator<char> *)0x6:
    paVar2 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
             cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                       ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        in_stack_ffffffffffffff50);
    array_storage::value(paVar2);
    pbVar3 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             json_array<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
             ::size((json_array<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
                     *)0x6667f7);
    if (pbVar3 <= in_RSI) {
      uVar4 = __cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff90,
                 (char *)CONCAT17(in_stack_ffffffffffffff8f,
                                  CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)),__a
                );
      json_runtime_error<std::out_of_range,_void>::json_runtime_error
                ((json_runtime_error<std::out_of_range,_void> *)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48);
      __cxa_throw(uVar4,&json_runtime_error<std::out_of_range,void>::typeinfo,
                  json_runtime_error<std::out_of_range,_void>::~json_runtime_error);
    }
    paVar2 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
             cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                       ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        in_stack_ffffffffffffff50);
    array_storage::value(paVar2);
    local_8 = json_array<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
              ::operator[](in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
  }
  return local_8;
}

Assistant:

const basic_json& at(std::size_t i) const
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    if (i >= cast<array_storage>().value().size())
                    {
                        JSONCONS_THROW(json_runtime_error<std::out_of_range>("Invalid array subscript"));
                    }
                    return cast<array_storage>().value().operator[](i);
                case json_storage_kind::object:
                    return cast<object_storage>().value().at(i);
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().at(i);
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().at(i);
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Index on non-array value not supported"));
            }
        }